

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_randomspawner.cpp
# Opt level: O1

void __thiscall ARandomSpawner::BeginPlay(ARandomSpawner *this)

{
  ActorFlags *pAVar1;
  ActorFlags2 *pAVar2;
  ActorFlags4 *pAVar3;
  int iVar4;
  BYTE *pBVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  DDropItem *pDVar9;
  PClass *pPVar10;
  PClassActor *pPVar11;
  PClassActor *pPVar12;
  uint uVar13;
  ulong uVar14;
  DDropItem *pDVar15;
  DVector3 local_50;
  FName local_34;
  
  bVar6 = (level.flags2 & 0x8000) == 0;
  bVar7 = (dmflags.Value & 0x1000U) == 0;
  AActor::BeginPlay(&this->super_AActor);
  pDVar9 = AActor::GetDropItems(&this->super_AActor);
  if (pDVar9 != (DDropItem *)0x0) {
    uVar13 = 0;
    pDVar15 = pDVar9;
    do {
      iVar4 = (pDVar15->Name).Index;
      if (iVar4 != 0) {
        if (bVar6 && bVar7) {
LAB_004bbf3b:
          if (pDVar15->Amount < 0) {
            pDVar15->Amount = 1;
          }
          uVar13 = uVar13 + pDVar15->Amount;
        }
        else {
          local_50.X = (double)CONCAT44(local_50.X._4_4_,iVar4);
          pPVar10 = PClass::FindClass((FName *)&local_50);
          if ((pPVar10 == (PClass *)0x0) || ((*(uint *)(pPVar10->Defaults + 0x1c4) >> 0xd & 1) == 0)
             ) goto LAB_004bbf3b;
        }
        pDVar15 = pDVar15->Next;
      }
    } while (pDVar15 != (DDropItem *)0x0);
    if (uVar13 != 0) {
      uVar8 = FRandom::GenRand32(&pr_randomspawn);
      uVar14 = (ulong)uVar8 % (ulong)uVar13;
      if (-1 < (int)uVar14) {
        pDVar15 = pDVar9;
        do {
          iVar4 = (pDVar15->Name).Index;
          if (iVar4 == 0) {
LAB_004bbfcd:
            pDVar9 = pDVar15->Next;
          }
          else {
            if (!bVar6 || !bVar7) {
              local_50.X = (double)CONCAT44(local_50.X._4_4_,iVar4);
              pPVar10 = PClass::FindClass((FName *)&local_50);
              if ((pPVar10 != (PClass *)0x0) &&
                 ((*(uint *)(pPVar10->Defaults + 0x1c4) >> 0xd & 1) != 0)) goto LAB_004bbfcd;
            }
            uVar13 = (int)uVar14 - pDVar15->Amount;
            uVar14 = (ulong)uVar13;
            pDVar9 = pDVar15->Next;
            if (pDVar15->Next == (DDropItem *)0x0 || (int)uVar13 < 0) {
              uVar14 = 0xffffffff;
              pDVar9 = pDVar15;
            }
          }
        } while ((-1 < (int)uVar14) && (pDVar15 = pDVar9, pDVar9 != (DDropItem *)0x0));
      }
      if ((pDVar9 != (DDropItem *)0x0) && ((this->super_AActor).bouncecount < 0x20)) {
        uVar13 = FRandom::GenRand32(&pr_randomspawn);
        if (pDVar9->Probability < (int)(uVar13 & 0xff)) {
          return;
        }
        local_50.X = (double)CONCAT44(local_50.X._4_4_,(pDVar9->Name).Index);
        pPVar10 = PClass::FindClass((FName *)&local_50);
        pPVar11 = dyn_cast<PClassActor>((DObject *)pPVar10);
        if (pPVar11 == (PClassActor *)0x0) {
          pPVar12 = (PClassActor *)0x0;
        }
        else {
          pPVar12 = PClassActor::GetReplacement(pPVar11,true);
          if (pPVar12 == (PClassActor *)0x0) {
            pPVar12 = pPVar11;
          }
        }
        if (pPVar12 != (PClassActor *)0x0) {
          (this->super_AActor).Species.super_FName.Index =
               (pPVar12->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.
               Index;
          pBVar5 = (pPVar12->super_PClass).Defaults;
          (this->super_AActor).Speed = *(double *)(pBVar5 + 0xe0);
          pAVar1 = &(this->super_AActor).flags;
          pAVar1->Value = pAVar1->Value | *(uint *)(pBVar5 + 0x1bc) & 0x10000;
          pAVar2 = &(this->super_AActor).flags2;
          pAVar2->Value = pAVar2->Value | *(uint *)(pBVar5 + 0x1c0) & 0x40000000;
          pAVar3 = &(this->super_AActor).flags4;
          pAVar3->Value = pAVar3->Value | *(uint *)(pBVar5 + 0x1c8) & 0x40000;
          return;
        }
        Printf("\x1cGUnknown item class %s to drop from a random spawner\n",
               FName::NameData.NameArray[(pDVar9->Name).Index].Text);
        (this->super_AActor).Species.super_FName.Index = 0;
        return;
      }
      local_34.Index = FName::NameManager::FindName(&FName::NameData,"Unknown",false);
      local_50.X = (this->super_AActor).__Pos.X;
      local_50.Y = (this->super_AActor).__Pos.Y;
      local_50.Z = (this->super_AActor).__Pos.Z;
      pPVar11 = ClassForSpawn(&local_34);
      AActor::StaticSpawn(pPVar11,&local_50,NO_REPLACE,false);
    }
    (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this);
  }
  return;
}

Assistant:

void BeginPlay()
	{
		DDropItem *di;   // di will be our drop item list iterator
		DDropItem *drop; // while drop stays as the reference point.
		int n = 0;
		bool nomonsters = (dmflags & DF_NO_MONSTERS) || (level.flags2 & LEVEL2_NOMONSTERS);

		Super::BeginPlay();
		drop = di = GetDropItems();
		if (di != NULL)
		{
			while (di != NULL)
			{
				if (di->Name != NAME_None)
				{
					if (!nomonsters || !IsMonster(di))
					{
						if (di->Amount < 0) di->Amount = 1; // default value is -1, we need a positive value.
						n += di->Amount; // this is how we can weight the list.
					}
					di = di->Next;
				}
			}
			if (n == 0)
			{ // Nothing left to spawn. They must have all been monsters, and monsters are disabled.
				Destroy();
				return;
			}
			// Then we reset the iterator to the start position...
			di = drop;
			// Take a random number...
			n = pr_randomspawn(n);
			// And iterate in the array up to the random number chosen.
			while (n > -1 && di != NULL)
			{
				if (di->Name != NAME_None &&
					(!nomonsters || !IsMonster(di)))
				{
					n -= di->Amount;
					if ((di->Next != NULL) && (n > -1))
						di = di->Next;
					else
						n = -1;
				}
				else
				{
					di = di->Next;
				}
			}
			// So now we can spawn the dropped item.
			if (di == NULL || bouncecount >= MAX_RANDOMSPAWNERS_RECURSION)	// Prevents infinite recursions
			{
				Spawn("Unknown", Pos(), NO_REPLACE);		// Show that there's a problem.
				Destroy();
				return;
			}
			else if (pr_randomspawn() <= di->Probability)	// prob 255 = always spawn, prob 0 = almost never spawn.
			{
				// Handle replacement here so as to get the proper speed and flags for missiles
				PClassActor *cls;
				cls = PClass::FindActor(di->Name);
				if (cls != NULL)
				{
					PClassActor *rep = cls->GetReplacement();
					if (rep != NULL)
					{
						cls = rep;
					}
				}
				if (cls != NULL)
				{
					Species = cls->TypeName;
					AActor *defmobj = GetDefaultByType(cls);
					this->Speed = defmobj->Speed;
					this->flags  |= (defmobj->flags  & MF_MISSILE);
					this->flags2 |= (defmobj->flags2 & MF2_SEEKERMISSILE);
					this->flags4 |= (defmobj->flags4 & MF4_SPECTRAL);
				}
				else
				{
					Printf(TEXTCOLOR_RED "Unknown item class %s to drop from a random spawner\n", di->Name.GetChars());
					Species = NAME_None;
				}
			}
		}
	}